

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O0

int linear_expansion_sum_zeroelim(int elen,double *e,int flen,double *f,double *h)

{
  bool bVar1;
  double dVar2;
  double local_a0;
  double g0;
  double fnow;
  double enow;
  int count;
  int hindex;
  int findex;
  int eindex;
  double around;
  double bround;
  double avirt;
  double bvirt;
  double R;
  double Qnew;
  double hh;
  double q;
  double Q;
  double *h_local;
  double *f_local;
  int flen_local;
  double *e_local;
  int elen_local;
  
  fnow = *e;
  dVar2 = *f;
  enow._4_4_ = 0;
  bVar1 = fnow < dVar2 != -fnow < dVar2;
  if (bVar1) {
    g0 = f[1];
    local_a0 = dVar2;
  }
  else {
    local_a0 = fnow;
    g0 = dVar2;
    fnow = e[1];
  }
  hindex = (int)!bVar1;
  count = (int)bVar1;
  if ((hindex < elen) && ((flen <= count || (fnow < g0 == -fnow < g0)))) {
    R = fnow + local_a0;
    dVar2 = R - fnow;
    hindex = hindex + 1;
    fnow = e[hindex];
  }
  else {
    R = g0 + local_a0;
    dVar2 = R - g0;
    count = count + 1;
    g0 = f[count];
  }
  hh = local_a0 - dVar2;
  q = R;
  for (enow._0_4_ = 2; enow._0_4_ < elen + flen; enow._0_4_ = enow._0_4_ + 1) {
    if ((hindex < elen) && ((flen <= count || (fnow < g0 == -fnow < g0)))) {
      bvirt = fnow + hh;
      dVar2 = bvirt - fnow;
      hindex = hindex + 1;
      fnow = e[hindex];
    }
    else {
      bvirt = g0 + hh;
      dVar2 = bvirt - g0;
      count = count + 1;
      g0 = f[count];
    }
    Qnew = hh - dVar2;
    dVar2 = q + bvirt;
    hh = (q - (dVar2 - (dVar2 - q))) + (bvirt - (dVar2 - q));
    if ((Qnew != 0.0) || (NAN(Qnew))) {
      h[enow._4_4_] = Qnew;
      enow._4_4_ = enow._4_4_ + 1;
    }
    q = dVar2;
  }
  if ((hh != 0.0) || (NAN(hh))) {
    h[enow._4_4_] = hh;
    enow._4_4_ = enow._4_4_ + 1;
  }
  if (((q != 0.0) || (NAN(q))) || (enow._4_4_ == 0)) {
    h[enow._4_4_] = q;
    enow._4_4_ = enow._4_4_ + 1;
  }
  return enow._4_4_;
}

Assistant:

int linear_expansion_sum_zeroelim(int elen, REAL *e, int flen, REAL *f,
                                  REAL *h)
/* h cannot be e or f. */
{
  REAL Q, q, hh;
  INEXACT REAL Qnew;
  INEXACT REAL R;
  INEXACT REAL bvirt;
  REAL avirt, bround, around;
  int eindex, findex, hindex;
  int count;
  REAL enow, fnow;
  REAL g0;

  enow = e[0];
  fnow = f[0];
  eindex = findex = 0;
  hindex = 0;
  if ((fnow > enow) == (fnow > -enow)) {
    g0 = enow;
    enow = e[++eindex];
  } else {
    g0 = fnow;
    fnow = f[++findex];
  }
  if ((eindex < elen) && ((findex >= flen)
                          || ((fnow > enow) == (fnow > -enow)))) {
    Fast_Two_Sum(enow, g0, Qnew, q);
    enow = e[++eindex];
  } else {
    Fast_Two_Sum(fnow, g0, Qnew, q);
    fnow = f[++findex];
  }
  Q = Qnew;
  for (count = 2; count < elen + flen; count++) {
    if ((eindex < elen) && ((findex >= flen)
                            || ((fnow > enow) == (fnow > -enow)))) {
      Fast_Two_Sum(enow, q, R, hh);
      enow = e[++eindex];
    } else {
      Fast_Two_Sum(fnow, q, R, hh);
      fnow = f[++findex];
    }
    Two_Sum(Q, R, Qnew, q);
    Q = Qnew;
    if (hh != 0) {
      h[hindex++] = hh;
    }
  }
  if (q != 0) {
    h[hindex++] = q;
  }
  if ((Q != 0.0) || (hindex == 0)) {
    h[hindex++] = Q;
  }
  return hindex;
}